

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O1

void __thiscall
QVariantAnimationPrivate::setValueAt(QVariantAnimationPrivate *this,qreal step,QVariant *value)

{
  KeyValues *this_00;
  iterator abegin;
  iterator iVar1;
  difference_type __d;
  ulong uVar2;
  ulong uVar4;
  long in_FS_OFFSET;
  undefined1 local_60 [32];
  undefined1 *puStack_40;
  long local_38;
  ulong uVar3;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((step < 0.0) || (1.0 < step)) {
    local_60._0_4_ = 2;
    local_60._4_4_ = 0;
    local_60._8_4_ = 0;
    local_60._12_4_ = 0;
    local_60._16_4_ = 0;
    local_60._20_4_ = 0;
    local_60._24_8_ = "default";
    QMessageLogger::warning
              ((QMessageLogger *)local_60,"QVariantAnimation::setValueAt: invalid step = %f");
    goto LAB_003bc5f1;
  }
  local_60._8_4_ = 0xaaaaaaaa;
  local_60._12_4_ = 0xaaaaaaaa;
  local_60._16_4_ = 0xaaaaaaaa;
  local_60._20_4_ = 0xaaaaaaaa;
  local_60._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_60._0_8_ = step;
  ::QVariant::QVariant((QVariant *)(local_60 + 8),value);
  this_00 = &this->keyValues;
  abegin = QList<std::pair<double,_QVariant>_>::begin(this_00);
  iVar1 = QList<std::pair<double,_QVariant>_>::end(this_00);
  if (0 < (long)iVar1.i - (long)abegin.i) {
    uVar3 = ((ulong)((long)iVar1.i - (long)abegin.i) >> 3) * -0x3333333333333333;
    do {
      uVar2 = uVar3 >> 1;
      uVar4 = uVar2;
      if (abegin.i[uVar2].first <= (double)local_60._0_8_ &&
          (double)local_60._0_8_ != abegin.i[uVar2].first) {
        uVar4 = ~uVar2 + uVar3;
        abegin.i = abegin.i + uVar2 + 1;
      }
      uVar3 = uVar4;
    } while (0 < (long)uVar4);
  }
  iVar1 = QList<std::pair<double,_QVariant>_>::end(this_00);
  if (abegin.i == iVar1.i) {
LAB_003bc5b0:
    QtPrivate::QMovableArrayOps<std::pair<double,_QVariant>_>::insert
              ((QMovableArrayOps<std::pair<double,_QVariant>_> *)this_00,
               ((long)abegin.i - (long)(this->keyValues).d.ptr >> 3) * -0x3333333333333333,1,
               (parameter_type)local_60);
    QList<std::pair<double,_QVariant>_>::begin(this_00);
  }
  else {
    if (((abegin.i)->first != step) || (NAN((abegin.i)->first) || NAN(step))) goto LAB_003bc5b0;
    if (*(ulong *)&(value->d).field_0x18 < 4) {
      QList<std::pair<double,_QVariant>_>::erase(this_00,(const_iterator)abegin.i,abegin.i + 1);
    }
    else {
      ::QVariant::operator=(&(abegin.i)->second,value);
    }
  }
  recalculateCurrentInterval(this,true);
  ::QVariant::~QVariant((QVariant *)(local_60 + 8));
LAB_003bc5f1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QVariantAnimationPrivate::setValueAt(qreal step, const QVariant &value)
{
    if (step < qreal(0.0) || step > qreal(1.0)) {
        qWarning("QVariantAnimation::setValueAt: invalid step = %f", step);
        return;
    }

    QVariantAnimation::KeyValue pair(step, value);

    QVariantAnimation::KeyValues::iterator result = std::lower_bound(keyValues.begin(), keyValues.end(), pair, animationValueLessThan);
    if (result == keyValues.end() || result->first != step) {
        keyValues.insert(result, pair);
    } else {
        if (value.isValid())
            result->second = value; // replaces the previous value
        else
            keyValues.erase(result); // removes the previous value
    }

    recalculateCurrentInterval(/*force=*/true);
}